

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

uint check_better_fast(MACROBLOCKD *xd,AV1_COMMON *cm,MV *this_mv,MV *best_mv,
                      SubpelMvLimits *mv_limits,SUBPEL_SEARCH_VAR_PARAMS *var_params,
                      MV_COST_PARAMS *mv_cost_params,uint *besterr,uint *sse1,int *distortion,
                      int *has_better_mv,int is_scaled)

{
  MV mv;
  int iVar1;
  aom_variance_fn_ptr_t *paVar2;
  buf_2d *pbVar3;
  buf_2d *pbVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  undefined8 in_RAX;
  uint8_t *puVar11;
  uint sse;
  
  sse = (uint)((ulong)in_RAX >> 0x20);
  mv = *this_mv;
  iVar8 = av1_is_subpelmv_in_range(mv_limits,mv);
  if (iVar8 == 0) {
    uVar10 = 0x7fffffff;
  }
  else {
    if (is_scaled == 0) {
      paVar2 = var_params->vfp;
      pbVar3 = (var_params->ms_buffers).ref;
      pbVar4 = (var_params->ms_buffers).src;
      iVar8 = pbVar3->stride;
      puVar11 = pbVar3->buf + (((int)mv >> 0x13) + ((int)mv.row >> 3) * iVar8);
      puVar5 = pbVar4->buf;
      iVar1 = pbVar4->stride;
      puVar6 = (var_params->ms_buffers).second_pred;
      uVar10 = (uint)mv >> 0x10 & 7;
      uVar9 = (uint)mv & 7;
      if (puVar6 == (uint8_t *)0x0) {
        uVar9 = (*paVar2->svf)(puVar11,iVar8,uVar10,uVar9,puVar5,iVar1,&sse);
      }
      else {
        puVar7 = (var_params->ms_buffers).mask;
        if (puVar7 == (uint8_t *)0x0) {
          uVar9 = (*paVar2->svaf)(puVar11,iVar8,uVar10,uVar9,puVar5,iVar1,&sse,puVar6);
        }
        else {
          uVar9 = (*paVar2->msvf)(puVar11,iVar8,uVar10,uVar9,puVar5,iVar1,puVar6,puVar7,
                                  (var_params->ms_buffers).mask_stride,
                                  (var_params->ms_buffers).inv_mask,&sse);
        }
      }
    }
    else {
      uVar9 = upsampled_pref_error(xd,cm,this_mv,var_params,&sse);
    }
    iVar8 = mv_err_cost_(this_mv,mv_cost_params);
    uVar10 = iVar8 + uVar9;
    if (uVar10 < *besterr) {
      *besterr = uVar10;
      *best_mv = *this_mv;
      *distortion = uVar9;
      *sse1 = sse;
      *(byte *)has_better_mv = (byte)*has_better_mv | 1;
    }
  }
  return uVar10;
}

Assistant:

static inline unsigned int check_better_fast(
    MACROBLOCKD *xd, const AV1_COMMON *cm, const MV *this_mv, MV *best_mv,
    const SubpelMvLimits *mv_limits, const SUBPEL_SEARCH_VAR_PARAMS *var_params,
    const MV_COST_PARAMS *mv_cost_params, unsigned int *besterr,
    unsigned int *sse1, int *distortion, int *has_better_mv, int is_scaled) {
  unsigned int cost;
  if (av1_is_subpelmv_in_range(mv_limits, *this_mv)) {
    unsigned int sse;
    int thismse;
    if (is_scaled) {
      thismse = upsampled_pref_error(xd, cm, this_mv, var_params, &sse);
    } else {
      thismse = estimated_pref_error(this_mv, var_params, &sse);
    }
    cost = mv_err_cost_(this_mv, mv_cost_params);
    cost += thismse;

    if (cost < *besterr) {
      *besterr = cost;
      *best_mv = *this_mv;
      *distortion = thismse;
      *sse1 = sse;
      *has_better_mv |= 1;
    }
  } else {
    cost = INT_MAX;
  }
  return cost;
}